

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquerymgr.cc
# Opt level: O0

void __thiscall
bdQueryManager::QueryStatus
          (bdQueryManager *this,
          map<bdNodeId,_bdQueryStatus,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdQueryStatus>_>_>
          *statusMap)

{
  iterator this_00;
  bool bVar1;
  reference ppbVar2;
  mapped_type *this_01;
  undefined1 local_50 [8];
  bdQueryStatus status;
  _List_iterator<bdQuery_*> local_20;
  iterator it;
  map<bdNodeId,_bdQueryStatus,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdQueryStatus>_>_>
  *statusMap_local;
  bdQueryManager *this_local;
  
  it._M_node = (_List_node_base *)statusMap;
  std::_List_iterator<bdQuery_*>::_List_iterator(&local_20);
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<bdQuery_*,_std::allocator<bdQuery_*>_>::begin(&this->mLocalQueries);
  while( true ) {
    status.mResults.super__List_base<bdId,_std::allocator<bdId>_>._M_impl._M_node._M_size =
         (size_t)std::__cxx11::list<bdQuery_*,_std::allocator<bdQuery_*>_>::end
                           (&this->mLocalQueries);
    bVar1 = std::operator!=(&local_20,
                            (_Self *)&status.mResults.super__List_base<bdId,_std::allocator<bdId>_>.
                                      _M_impl._M_node._M_size);
    if (!bVar1) break;
    bdQueryStatus::bdQueryStatus((bdQueryStatus *)local_50);
    ppbVar2 = std::_List_iterator<bdQuery_*>::operator*(&local_20);
    local_50._0_4_ = (*ppbVar2)->mState;
    ppbVar2 = std::_List_iterator<bdQuery_*>::operator*(&local_20);
    local_50._4_4_ = (*ppbVar2)->mQueryFlags;
    ppbVar2 = std::_List_iterator<bdQuery_*>::operator*(&local_20);
    bdQuery::result(*ppbVar2,(list<bdId,_std::allocator<bdId>_> *)&status);
    this_00 = it;
    ppbVar2 = std::_List_iterator<bdQuery_*>::operator*(&local_20);
    this_01 = std::
              map<bdNodeId,_bdQueryStatus,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdQueryStatus>_>_>
              ::operator[]((map<bdNodeId,_bdQueryStatus,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdQueryStatus>_>_>
                            *)this_00._M_node,&(*ppbVar2)->mId);
    bdQueryStatus::operator=(this_01,(bdQueryStatus *)local_50);
    bdQueryStatus::~bdQueryStatus((bdQueryStatus *)local_50);
    std::_List_iterator<bdQuery_*>::operator++(&local_20,0);
  }
  return;
}

Assistant:

void bdQueryManager::QueryStatus(std::map<bdNodeId, bdQueryStatus> &statusMap) {
	std::list<bdQuery *>::iterator it;
	for (it = mLocalQueries.begin(); it != mLocalQueries.end(); it++) {
		bdQueryStatus status;
		status.mStatus = (*it)->mState;
		status.mQFlags = (*it)->mQueryFlags;
		(*it)->result(status.mResults);
		statusMap[(*it)->mId] = status;
	}
}